

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qual_hostname.c
# Opt level: O1

int get_self_ip_addr(void *cm,CMtrans_services_conflict svc)

{
  ushort uVar1;
  ushort *puVar2;
  CMTransport_trace p_Var3;
  long lVar4;
  long *plVar5;
  long *plVar6;
  uint *puVar7;
  uint uVar8;
  bool bVar9;
  int iVar10;
  int iVar11;
  in_addr_t iVar12;
  char *pcVar13;
  char *pcVar14;
  hostent *phVar15;
  void *__ptr;
  uint unaff_EBP;
  in_addr *in;
  long **pplVar16;
  void *pvVar17;
  uint uVar18;
  ulong uVar19;
  char **ppcVar20;
  bool bVar21;
  ifaddrs *if_addrs;
  ifconf ifaces;
  char buf [46];
  char hostname_buf [256];
  long *local_180;
  int local_178 [2];
  void *local_170;
  char local_168 [48];
  char local_138 [264];
  
  pplVar16 = &local_180;
  local_180 = (long *)0x0;
  iVar10 = getifaddrs(pplVar16);
  plVar5 = local_180;
  if (iVar10 == 0) {
    for (; plVar5 != (long *)0x0; plVar5 = (long *)*plVar5) {
      puVar2 = (ushort *)plVar5[3];
      if (puVar2 != (ushort *)0x0) {
        uVar1 = *puVar2;
        if ((uVar1 & 0xfff7) == 2 && svc != (CMtrans_services_conflict)0x0) {
          p_Var3 = svc->trace_out;
          lVar4 = plVar5[1];
          pcVar13 = inet_ntop((uint)uVar1,puVar2 + (ulong)(uVar1 != 2) * 2 + 2,local_168,0x2e);
          (*p_Var3)((CManager)cm,"CM<transport> IP possibility -> %s : %s",lVar4,pcVar13);
        }
      }
    }
    pcVar13 = getenv("CM_INTERFACE");
    unaff_EBP = 0;
    if (pcVar13 == (char *)0x0) {
LAB_00102fa3:
      gethostname(local_138,0x100);
      phVar15 = gethostbyname(local_138);
      if (phVar15 != (hostent *)0x0) {
        ppcVar20 = phVar15->h_addr_list;
        puVar7 = (uint *)*ppcVar20;
        while (puVar7 != (uint *)0x0) {
          ppcVar20 = ppcVar20 + 1;
          uVar18 = *puVar7;
          if ((byte)uVar18 != 0x7f) {
            if (svc != (CMtrans_services_conflict)0x0) {
              (*svc->trace_out)((CManager)cm,
                                "CM<transport> Prefer IP associated with hostname net -> %d.%d.%d.%d"
                                ,(ulong)(byte)*puVar7,(ulong)*(byte *)((long)puVar7 + 1),
                                (ulong)*(byte *)((long)puVar7 + 2),
                                (ulong)*(byte *)((long)puVar7 + 3));
            }
            freeifaddrs(local_180);
            uVar8 = *puVar7;
            unaff_EBP = uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 |
                        uVar8 << 0x18;
          }
          if ((byte)uVar18 != 0x7f) goto LAB_00102f88;
          puVar7 = (uint *)*ppcVar20;
        }
      }
      pplVar16 = &local_180;
      do {
        pplVar16 = (long **)*pplVar16;
        bVar21 = pplVar16 == (long **)0x0;
        if (bVar21) break;
        plVar5 = pplVar16[3];
        bVar9 = true;
        if (((plVar5 != (long *)0x0) && ((short)*plVar5 == 2)) && (((ulong)pplVar16[2] & 8) == 0)) {
          if (svc != (CMtrans_services_conflict)0x0) {
            p_Var3 = svc->trace_out;
            plVar6 = pplVar16[1];
            pcVar13 = inet_ntop(2,(uint *)((long)plVar5 + 4),local_168,0x2e);
            (*p_Var3)((CManager)cm,"CM<transport> get_self_ip_addr returning first avail -> %s : %s"
                      ,plVar6,pcVar13);
          }
          uVar18 = *(uint *)((long)plVar5 + 4);
          unaff_EBP = uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 |
                      uVar18 << 0x18;
          freeifaddrs(local_180);
          bVar9 = false;
        }
      } while (bVar9);
    }
    else {
      do {
        pplVar16 = (long **)*pplVar16;
        if (pplVar16 == (long **)0x0) {
          printf("Warning!  CM_INTERFACE specified as \"%s\", but no active interface by that name found\n"
                 ,pcVar13);
          goto LAB_00102fa3;
        }
        plVar5 = pplVar16[3];
        bVar21 = true;
        if ((plVar5 != (long *)0x0) && ((short)*plVar5 == 2)) {
          plVar6 = pplVar16[1];
          iVar10 = strcmp((char *)plVar6,pcVar13);
          if (iVar10 == 0) {
            if (svc != (CMtrans_services_conflict)0x0) {
              p_Var3 = svc->trace_out;
              pcVar14 = inet_ntop(2,(uint *)((long)plVar5 + 4),local_168,0x2e);
              (*p_Var3)((CManager)cm,"CM<transport> Interface specified, returning ->%s : %s",plVar6
                        ,pcVar14);
            }
            freeifaddrs(local_180);
            uVar18 = *(uint *)((long)plVar5 + 4);
            unaff_EBP = uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 |
                        uVar18 << 0x18;
            bVar21 = false;
          }
        }
      } while (bVar21);
LAB_00102f88:
      bVar21 = false;
    }
    if (!bVar21) {
      return unaff_EBP;
    }
  }
  if (local_180 != (long *)0x0) {
    freeifaddrs();
  }
  gethostname(local_138,0x100);
  phVar15 = gethostbyname(local_138);
  if (phVar15 != (hostent *)0x0) {
    ppcVar20 = phVar15->h_addr_list;
    puVar7 = (uint *)*ppcVar20;
    while (puVar7 != (uint *)0x0) {
      ppcVar20 = ppcVar20 + 1;
      uVar18 = *puVar7;
      uVar8 = uVar18 << 0x18;
      if (uVar8 != 0x7f000000) {
        if (svc != (CMtrans_services_conflict)0x0) {
          (*svc->trace_out)((CManager)cm,"CM<transport> - Get self IP addr %lx, net %d.%d.%d.%d",
                            (ulong)(uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 |
                                    (uVar18 & 0xff00) << 8 | uVar8),(ulong)(byte)*puVar7,
                            (ulong)*(byte *)((long)puVar7 + 1),(ulong)*(byte *)((long)puVar7 + 2),
                            (uint)*(byte *)((long)puVar7 + 3));
        }
        uVar18 = *puVar7;
        unaff_EBP = uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 |
                    uVar18 << 0x18;
      }
      if (uVar8 != 0x7f000000) {
        return unaff_EBP;
      }
      puVar7 = (uint *)*ppcVar20;
    }
  }
  iVar12 = 0;
  iVar10 = socket(2,2,0);
  local_178[0] = 0xa00;
  __ptr = malloc(0xa00);
  local_170 = __ptr;
  iVar11 = ioctl(iVar10,0x8912,local_178);
  if ((-1 < iVar11) &&
     (uVar19 = (ulong)(long)local_178[0] / 0x28, pvVar17 = local_170, (int)uVar19 != 0)) {
    do {
      ioctl(iVar10,0x8913,pvVar17);
      uVar1 = *(ushort *)((long)pvVar17 + 0x10);
      if ((uVar1 & 8) == 0) {
        if ((uVar1 & 1) == 0) {
          pcVar13 = "CM<transport> - Get self IP addr %lx, rejected, not UP";
          goto LAB_00103214;
        }
        if ((uVar1 & 0x40) == 0) {
          pcVar13 = "CM<transport> - Get self IP addr %lx, rejected, not RUNNING";
          goto LAB_00103214;
        }
        uVar18 = *(uint *)((long)pvVar17 + 0x14);
        if ((uVar18 != 0) && (uVar18 != 0x7f000001)) {
          iVar12 = uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 |
                   uVar18 << 0x18;
          if (svc != (CMtrans_services_conflict)0x0) {
            (*svc->trace_out)((CManager)cm,
                              "CM<transport> - Get self IP addr DHCP %lx, net %d.%d.%d.%d",
                              (ulong)iVar12,(ulong)*(byte *)((long)pvVar17 + 0x14),
                              (ulong)*(byte *)((long)pvVar17 + 0x15),
                              (ulong)*(byte *)((long)pvVar17 + 0x16),
                              (uint)*(byte *)((long)pvVar17 + 0x17));
          }
          goto LAB_00103294;
        }
      }
      else {
        pcVar13 = "CM<transport> - Get self IP addr %lx, rejected, loopback";
LAB_00103214:
        if (svc != (CMtrans_services_conflict)0x0) {
          uVar18 = *(uint *)((long)pvVar17 + 0x14);
          (*svc->trace_out)((CManager)cm,pcVar13,
                            (ulong)(uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 |
                                    (uVar18 & 0xff00) << 8 | uVar18 << 0x18));
        }
      }
      uVar18 = (int)uVar19 - 1;
      uVar19 = (ulong)uVar18;
      pvVar17 = (void *)((long)pvVar17 + 0x28);
    } while (uVar18 != 0);
    iVar12 = 0;
  }
LAB_00103294:
  close(iVar10);
  free(__ptr);
  if (iVar12 == 0) {
    pcVar13 = getenv("CM_LAST_RESORT_IP_ADDR");
    if (svc != (CMtrans_services_conflict)0x0) {
      (*svc->trace_out)((CManager)cm,"CM<transport> - Get self IP addr at last resort");
    }
    if (pcVar13 == (char *)0x0) {
      iVar12 = 0;
    }
    else {
      if (svc != (CMtrans_services_conflict)0x0) {
        (*svc->trace_out)((CManager)cm,"CM<transport> - Translating last resort %s",pcVar13);
      }
      iVar12 = inet_addr(pcVar13);
    }
  }
  return iVar12;
}

Assistant:

static int
get_self_ip_addr(void *cm, CMtrans_services svc)
{
    struct hostent *host;
    char hostname_buf[256];
    char **p;
#ifdef HAVE_GETIFADDRS
  struct ifaddrs *if_addrs = NULL;
  struct ifaddrs *if_addr = NULL;
  void *tmp = NULL;
  char buf[INET6_ADDRSTRLEN];
#endif
#ifdef SIOCGIFCONF
    char *ifreqs;
    struct ifreq *ifr;
    struct sockaddr_in *sai;
    struct ifconf ifaces;
    int ifrn;
    int ss;
    int ipv4_count = 0;
    int ipv6_count = 0;
#endif
    int rv = 0;
#ifdef HAVE_GETIFADDRS
    if (getifaddrs(&if_addrs) == 0) {    
        char *interface;
	// Print possible addresses
	for (if_addr = if_addrs; if_addr != NULL; if_addr = if_addr->ifa_next) {
	    int family;
	    if (!if_addr->ifa_addr) continue;
	    family = if_addr->ifa_addr->sa_family;
	    if ((family != AF_INET) && (family != AF_INET6)) continue;
	    if (if_addr->ifa_addr->sa_family == AF_INET) {
	        tmp = &((struct sockaddr_in *)if_addr->ifa_addr)->sin_addr;
		ipv4_count++;
	    } else {
	        tmp = &((struct sockaddr_in6 *)if_addr->ifa_addr)->sin6_addr;
		ipv6_count++;
	    }
	    if (svc) {
	        svc->trace_out(cm, "CM<transport> IP possibility -> %s : %s",
			       if_addr->ifa_name,
			       inet_ntop(family, tmp, buf, sizeof(buf)));
	    }
	}
	if ((interface = getenv("CM_INTERFACE")) != NULL) {
	    for (if_addr = if_addrs; if_addr != NULL; if_addr = if_addr->ifa_next) {
	        int family;
	        if (!if_addr->ifa_addr) continue;
		family = if_addr->ifa_addr->sa_family;
		if (family != AF_INET) continue;  /* currently not looking for ipv6 */
		if (strcmp(if_addr->ifa_name, interface) != 0) continue;
		tmp = &((struct sockaddr_in *)if_addr->ifa_addr)->sin_addr;
		if (svc) {
		    svc->trace_out(cm, "CM<transport> Interface specified, returning ->%s : %s",
				   if_addr->ifa_name,
				   inet_ntop(family, tmp, buf, sizeof(buf)));
		}
		freeifaddrs(if_addrs);
		return (ntohl(*(uint32_t*)tmp));
	    }
	    printf("Warning!  CM_INTERFACE specified as \"%s\", but no active interface by that name found\n", interface);
	}
	    
	gethostname(hostname_buf, sizeof(hostname_buf));
	host = gethostbyname(hostname_buf);
	if (host != NULL) {
	    for (p = host->h_addr_list; *p != 0; p++) {
		struct in_addr *in = *(struct in_addr **) p;
		if (!ipv4_is_loopback(ntohl(in->s_addr))) {
		    if (svc)
			svc->trace_out(cm, "CM<transport> Prefer IP associated with hostname net -> %d.%d.%d.%d",
				       *((unsigned char *) &in->s_addr),
				       *(((unsigned char *) &in->s_addr) + 1),
				       *(((unsigned char *) &in->s_addr) + 2),
				       *(((unsigned char *) &in->s_addr) + 3));
		    freeifaddrs(if_addrs);
		    return (ntohl(in->s_addr));
		}
	    }
	}
	/* choose the first thing that's not a loopback interface */
	for (if_addr = if_addrs; if_addr != NULL; if_addr = if_addr->ifa_next) {
	    int family;
	    uint32_t ret_ip;
	    if (!if_addr->ifa_addr) continue;
	    family = if_addr->ifa_addr->sa_family;
	    if (family != AF_INET) continue;  /* currently not looking for ipv6 */
	    if ((if_addr->ifa_flags & IFF_LOOPBACK) != 0)  continue;
	    tmp = &((struct sockaddr_in *)if_addr->ifa_addr)->sin_addr;
	    if (svc) {
		svc->trace_out(cm, "CM<transport> get_self_ip_addr returning first avail -> %s : %s",
			       if_addr->ifa_name,
			       inet_ntop(family, tmp, buf, sizeof(buf)));
	    }
	    ret_ip = (ntohl(*(uint32_t*)tmp));
	    freeifaddrs(if_addrs);
	    return ret_ip;
	}
    }
    if (if_addrs) freeifaddrs(if_addrs);
#endif	
    gethostname(hostname_buf, sizeof(hostname_buf));
    host = gethostbyname(hostname_buf);
    if (host != NULL) {
	for (p = host->h_addr_list; *p != 0; p++) {
	    struct in_addr *in = *(struct in_addr **) p;
	    if (!ipv4_is_loopback(ntohl(in->s_addr))) {
		if (svc)
		    svc->trace_out(cm, "CM<transport> - Get self IP addr %lx, net %d.%d.%d.%d",
				   ntohl(in->s_addr),
				   *((unsigned char *) &in->s_addr),
				   *(((unsigned char *) &in->s_addr) + 1),
				   *(((unsigned char *) &in->s_addr) + 2),
				   *(((unsigned char *) &in->s_addr) + 3));
		return (ntohl(in->s_addr));
	    }
	}
    }
    /*
     *  Since we couldn't find an IP address in some logical way, we'll open
     *  a DGRAM socket and ask it first for the list of its interfaces, and
     *  then checking for an interface we can use, and then finally asking that
     *  interface what its address is.
     */
#ifdef SIOCGIFCONF
    ss = socket(AF_INET, SOCK_DGRAM, 0);
    ifaces.ifc_len = 64 * sizeof(struct ifreq);
    ifaces.ifc_buf = ifreqs = malloc(ifaces.ifc_len);
    /*
     *  if we can't SIOCGIFCONF we're kind of dead anyway, bail.
     */
    if (ioctl(ss, SIOCGIFCONF, &ifaces) >= 0) {
	ifr = ifaces.ifc_req;
	ifrn = ifaces.ifc_len / sizeof(struct ifreq);
	for (; ifrn--; ifr++) {
	    /*
	     * Basically we'll take the first interface satisfying 
	     * the following: 
	     *   up, running, not loopback, address family is INET.
	     */
	    ioctl(ss, SIOCGIFFLAGS, ifr);
	    sai = (struct sockaddr_in *) &(ifr->ifr_addr);
	    if (ifr->ifr_flags & IFF_LOOPBACK) {
		if (svc)
		    svc->trace_out(cm, "CM<transport> - Get self IP addr %lx, rejected, loopback",
				   ntohl(sai->sin_addr.s_addr));
		continue;
	    }
	    if (!(ifr->ifr_flags & IFF_UP)) {
		if (svc)
		    svc->trace_out(cm, "CM<transport> - Get self IP addr %lx, rejected, not UP",
				   ntohl(sai->sin_addr.s_addr));
		continue;
	    }
	    if (!(ifr->ifr_flags & IFF_RUNNING)) {
		if (svc)
		    svc->trace_out(cm, "CM<transport> - Get self IP addr %lx, rejected, not RUNNING",
				   ntohl(sai->sin_addr.s_addr));
		continue;
	    }
	    /*
	     * sure would be nice to test for AF_INET here but it doesn't
	     * cooperate and I've done enough for now ...
	     * if (sai->sin_addr.s.addr != AF_INET) continue;
	    */
	    if (sai->sin_addr.s_addr == INADDR_ANY)
		continue;
	    if (sai->sin_addr.s_addr == INADDR_LOOPBACK)
		continue;
	    rv = ntohl(sai->sin_addr.s_addr);
	    if (svc)
		svc->trace_out(cm, "CM<transport> - Get self IP addr DHCP %lx, net %d.%d.%d.%d",
			       ntohl(sai->sin_addr.s_addr),
			       *((unsigned char *) &sai->sin_addr.s_addr),
			       *(((unsigned char *) &sai->sin_addr.s_addr) + 1),
			       *(((unsigned char *) &sai->sin_addr.s_addr) + 2),
			       *(((unsigned char *) &sai->sin_addr.s_addr) + 3));
	    break;
	}
    }
    close(ss);
    free(ifreqs);
#endif
    /*
     *  Absolute last resort.  If we can't figure out anything else, look
     *  for the CM_LAST_RESORT_IP_ADDR environment variable.
     */
    if (rv == 0) {
	char *c = getenv("CM_LAST_RESORT_IP_ADDR");
	if (svc)
	    svc->trace_out(cm, "CM<transport> - Get self IP addr at last resort");
	if (c != NULL) {
	    if (svc)
		svc->trace_out(cm, "CM<transport> - Translating last resort %s", c);
	    rv = inet_addr(c);
	}
    }
    /*
     *	hopefully by now we've set rv to something useful.  If not,
     *  GET A BETTER NETWORK CONFIGURATION.
     */
    return rv;
}